

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileDescriptorSet::InternalSerializeWithCachedSizesToArray
          (FileDescriptorSet *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *target_00;
  uint8 *in_RSI;
  EpsCopyOutputStream *in_RDI;
  EpsCopyOutputStream *in_stack_00000008;
  uint8 *in_stack_00000010;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff58;
  uint local_90;
  uint8 *local_80;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint8 **target_01;
  uint8 **this_00;
  
  local_90 = 0;
  uVar1 = _internal_file_size((FileDescriptorSet *)0x673765);
  local_80 = in_RSI;
  for (; local_90 < uVar1; local_90 = local_90 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(in_RDI,in_stack_ffffffffffffff58);
    _internal_file((FileDescriptorSet *)in_RDI,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffffac = 1;
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_80);
    uVar2 = FileDescriptorProto::GetCachedSize((FileDescriptorProto *)0x673824);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,target_00);
    local_80 = FileDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (_i,in_stack_00000010,in_stack_00000008);
  }
  target_01 = &in_RDI->buffer_end_;
  if (((uint)*target_01 & 1) == 1) {
    this_00 = &in_RDI->buffer_end_;
    if (((uint)*this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_80 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)this_00,(uint8 *)target_01,
                          (EpsCopyOutputStream *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return local_80;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorSet::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorSet)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.FileDescriptorProto file = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_file_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(1, this->_internal_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorSet)
  return target;
}